

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

uint32_t getSectIDIfAny(Section *sect)

{
  Section *pSVar1;
  uint32_t uVar2;
  Section **ppSVar3;
  
  if (sect == (Section *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = 0;
    ppSVar3 = &sectionList;
    while( true ) {
      pSVar1 = *ppSVar3;
      if (pSVar1 == (Section *)0x0) {
        fatalerror("Unknown section \'%s\'\n",sect->name);
      }
      if (pSVar1 == sect) break;
      uVar2 = uVar2 + 1;
      ppSVar3 = &pSVar1->next;
    }
  }
  return uVar2;
}

Assistant:

static uint32_t getSectIDIfAny(struct Section const *sect)
{
	return sect ? getsectid(sect) : (uint32_t)-1;
}